

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.cpp
# Opt level: O2

CloudMediumProvider *
pbrt::CloudMediumProvider::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  int iVar1;
  undefined4 extraout_var;
  undefined1 auVar3 [16];
  undefined1 extraout_var_00 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  Point3f PVar7;
  allocator<char> local_71;
  string local_70;
  Tuple3<pbrt::Point3,_float> local_50;
  Float local_44;
  Float local_40;
  Float local_3c;
  Tuple3<pbrt::Point3,_float> local_38;
  Tuple3<pbrt::Point3,_float> local_28;
  CloudMediumProvider *pCVar2;
  undefined1 auVar6 [56];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"density",(allocator<char> *)&local_50);
  local_3c = ParameterDictionary::GetOneFloat(parameters,&local_70,1.0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"wispiness",(allocator<char> *)&local_50);
  local_40 = ParameterDictionary::GetOneFloat(parameters,&local_70,1.0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"frequency",(allocator<char> *)&local_50);
  local_44 = ParameterDictionary::GetOneFloat(parameters,&local_70,5.0);
  std::__cxx11::string::~string((string *)&local_70);
  auVar6 = extraout_var_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"p0",(allocator<char> *)&local_38);
  local_28.x = 0.0;
  local_28.y = 0.0;
  local_28.z = 0.0;
  PVar7 = ParameterDictionary::GetOnePoint3f(parameters,&local_70,(Point3f *)&local_28);
  local_50.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar4._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar4._8_56_ = auVar6;
  local_50._0_8_ = vmovlps_avx(auVar4._0_16_);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"p1",&local_71);
  auVar3._8_4_ = 0x3f800000;
  auVar3._0_8_ = 0x3f8000003f800000;
  auVar3._12_4_ = 0x3f800000;
  auVar6 = ZEXT856(auVar3._8_8_);
  local_38._0_8_ = vmovlps_avx(auVar3);
  local_38.z = 1.0;
  PVar7 = ParameterDictionary::GetOnePoint3f(parameters,&local_70,(Point3f *)&local_38);
  local_28.z = PVar7.super_Tuple3<pbrt::Point3,_float>.z;
  auVar5._0_8_ = PVar7.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar6;
  local_28._0_8_ = vmovlps_avx(auVar5._0_16_);
  std::__cxx11::string::~string((string *)&local_70);
  Bounds3<float>::Bounds3
            ((Bounds3<float> *)&local_70,(Point3<float> *)&local_50,(Point3<float> *)&local_28);
  iVar1 = (*(alloc.memoryResource)->_vptr_memory_resource[2])(alloc.memoryResource,0x24,4);
  pCVar2 = (CloudMediumProvider *)CONCAT44(extraout_var,iVar1);
  *(pointer *)&(pCVar2->bounds).pMin.super_Tuple3<pbrt::Point3,_float> = local_70._M_dataplus._M_p;
  *(size_type *)&(pCVar2->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z =
       local_70._M_string_length;
  (pCVar2->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y =
       (float)local_70.field_2._M_allocated_capacity._0_4_;
  (pCVar2->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)local_70.field_2._M_allocated_capacity._4_4_;
  pCVar2->density = local_3c;
  pCVar2->wispiness = local_40;
  pCVar2->frequency = local_44;
  return pCVar2;
}

Assistant:

CloudMediumProvider *CloudMediumProvider::Create(const ParameterDictionary &parameters,
                                                 const FileLoc *loc, Allocator alloc) {
    Float density = parameters.GetOneFloat("density", 1);
    Float wispiness = parameters.GetOneFloat("wispiness", 1);
    Float frequency = parameters.GetOneFloat("frequency", 5);

    Point3f p0 = parameters.GetOnePoint3f("p0", Point3f(0.f, 0.f, 0.f));
    Point3f p1 = parameters.GetOnePoint3f("p1", Point3f(1.f, 1.f, 1.f));

    return alloc.new_object<CloudMediumProvider>(Bounds3f(p0, p1), density, wispiness,
                                                 frequency);
}